

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,TypeCast *c)

{
  pool_ref<soul::AST::Expression> *e;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  CommaSeparatedList *list_00;
  Expression *pEVar4;
  Constant *pCVar5;
  Constant *pCVar6;
  pool_ptr<soul::AST::Constant> cv;
  pool_ptr<soul::AST::CommaSeparatedList> list;
  pool_ptr<soul::AST::Constant> local_d8;
  Value local_d0;
  pool_ref<soul::AST::Expression> local_90;
  Type local_88;
  Value local_70;
  
  e = &c->source;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
  bVar1 = ErrorIgnoringRewritingASTVisitor::failIfNotResolved
                    (&this->super_ErrorIgnoringRewritingASTVisitor,&c->super_Expression);
  if (!bVar1) {
    sVar3 = AST::TypeCast::getNumArguments(c);
    if (sVar3 == 0) {
      Type::Type(&local_88,&c->targetType);
      soul::Value::zeroInitialiser(&local_70,&local_88);
      pEVar4 = createConstant(this,&(c->super_Expression).super_Statement.super_ASTObject.context,
                              &local_70);
      soul::Value::~Value(&local_70);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_88.structure);
      return pEVar4;
    }
    local_90.object = e->object;
    cast<soul::AST::CommaSeparatedList,soul::AST::Expression>((soul *)&local_d0,&local_90);
    if (CONCAT71(local_d0.type._1_7_,local_d0.type.category) != 0) {
      list_00 = pool_ptr<soul::AST::CommaSeparatedList>::operator*
                          ((pool_ptr<soul::AST::CommaSeparatedList> *)&local_d0);
      pEVar4 = convertExpressionListToConstant(this,&c->super_Expression,&c->targetType,list_00);
      return pEVar4;
    }
    pCVar6 = (Constant *)e->object;
    if ((pCVar6->super_Expression).kind == value) {
      iVar2 = (*(pCVar6->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])
                        (pCVar6);
      pCVar6 = (Constant *)e->object;
      if ((char)iVar2 != '\0') {
        (*(pCVar6->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])
                  (&local_d0,pCVar6);
        bVar1 = Type::isIdentical(&local_d0.type,&c->targetType);
        RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_d0.type.structure);
        pCVar6 = (Constant *)e->object;
        if (bVar1) {
          return &pCVar6->super_Expression;
        }
      }
    }
    (*(pCVar6->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[0xd])
              (&local_d8,pCVar6);
    if (local_d8.object != (Constant *)0x0) {
      pCVar5 = pool_ptr<soul::AST::Constant>::operator->(&local_d8);
      soul::Value::tryCastToType(&local_d0,&pCVar5->value,&c->targetType);
      if (local_d0.type.category != invalid) {
        pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value&>
                           (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                            &(c->super_Expression).super_Statement.super_ASTObject.context,&local_d0
                           );
      }
      soul::Value::~Value(&local_d0);
      if (local_d0.type.category != invalid) {
        return &pCVar6->super_Expression;
      }
    }
  }
  return &c->super_Expression;
}

Assistant:

AST::Expression& visit (AST::TypeCast& c) override
        {
            super::visit (c);

            if (failIfNotResolved (c))
                return c;

            if (c.getNumArguments() == 0)
                return createConstant (c.context, Value::zeroInitialiser (c.targetType));

            if (auto list = cast<AST::CommaSeparatedList> (c.source))
                return convertExpressionListToConstant (c, c.targetType, *list);

            if (AST::isResolvedAsValue (c.source.get()) && c.source->getResultType().isIdentical (c.targetType))
                return c.source;

            if (auto cv = c.source->getAsConstant())
            {
                auto castValue = cv->value.tryCastToType (c.targetType);

                if (castValue.isValid())
                    return allocator.allocate<AST::Constant> (c.context, castValue);
            }

            return c;
        }